

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

float __thiscall CProficiencies::ProfEffect(CProficiencies *this,char *profname,float nArg)

{
  bool bVar1;
  short sVar2;
  int from;
  int iVar3;
  char *in_RSI;
  CProficiencies *in_RDI;
  float in_XMM0_Da;
  int pindex;
  CProficiencies *this_00;
  float local_4;
  
  this_00 = in_RDI;
  sVar2 = ProfIndexLookup(in_RSI);
  from = (int)sVar2;
  if (from == -1) {
    local_4 = 0.0;
  }
  else {
    bVar1 = str_cmp(in_RSI,"appraising");
    if (bVar1) {
      bVar1 = str_cmp(in_RSI,"trap detecting");
      if (bVar1) {
        bVar1 = str_cmp(in_RSI,"firestarting");
        if (bVar1) {
          local_4 = 0.0;
        }
        else {
          local_4 = (in_XMM0_Da + 25.0) / 25.0;
        }
      }
      else {
        iVar3 = number_range(from,(int)((ulong)in_RDI >> 0x20));
        local_4 = (float)(iVar3 + in_RDI->profs[from]);
      }
    }
    else {
      CheckImprove(this_00,in_RSI,(int)in_XMM0_Da);
      local_4 = (float)(100 - (in_RDI->profs[from] * 2 + 10));
    }
  }
  return local_4;
}

Assistant:

float CProficiencies::ProfEffect(char *profname, float nArg)
{
	int pindex = ProfIndexLookup(profname);
	if (pindex == -1)
		return 0;

	if (!str_cmp(profname, "appraising"))
	{
		CheckImprove(profname, 50);
		return 100 - ((profs[pindex] * 2) + 10); // 12% off at 1, 30% at 10
	}

	if (!str_cmp(profname, "trap detecting"))
	{
		//returned value needs to be >= than quality of the trap to detect its presence
		//if you have a skill of 1 and a trap of 5, you need a rnd >=4 (40% chance)
		//if you have a skill of 1 and a trap of 9, you need a rnd =8 (10% chance)
		//if you have a skill of 1 and a trap of 1, you need a rnd >=0 (80% chance)
		//that's for detection in adjacent room, to avoid the trap as it fires the chance is detect / 2
		return number_range(-2, 8) + profs[pindex];
	}

	if (!str_cmp(profname, "firestarting"))
	{
		return (nArg + 25) / 25; // multiplied by gain to get hp gain
	}

	return 0;
}